

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
__thiscall duckdb::InitEnumCastLocalState(duckdb *this,CastLocalStateParameters *parameters)

{
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var2;
  BoundCastData *pBVar3;
  pointer pEVar4;
  CastLocalStateParameters from_varchar_params;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_38;
  _Head_base<0UL,_duckdb::EnumCastLocalState_*,_false> local_30;
  ClientContext *local_28;
  _func_int **local_20;
  
  pBVar3 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  make_uniq<duckdb::EnumCastLocalState>();
  if (pBVar3[5]._vptr_BoundCastData != (_func_int **)0x0) {
    local_20 = pBVar3[6]._vptr_BoundCastData;
    local_28 = (parameters->context).ptr;
    (*(code *)pBVar3[5]._vptr_BoundCastData)(&local_38);
    pEVar4 = unique_ptr<duckdb::EnumCastLocalState,_std::default_delete<duckdb::EnumCastLocalState>,_true>
             ::operator->((unique_ptr<duckdb::EnumCastLocalState,_std::default_delete<duckdb::EnumCastLocalState>,_true>
                           *)&local_30);
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (FunctionLocalState *)0x0;
    _Var1._M_head_impl =
         (pEVar4->from_varchar_local).
         super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
         .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
    (pEVar4->from_varchar_local).
    super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
    .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (FunctionLocalState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_FunctionLocalState[1])();
      if (local_38._M_head_impl != (FunctionLocalState *)0x0) {
        (*(local_38._M_head_impl)->_vptr_FunctionLocalState[1])();
      }
    }
  }
  if (pBVar3[2]._vptr_BoundCastData != (_func_int **)0x0) {
    local_20 = pBVar3[3]._vptr_BoundCastData;
    local_28 = (parameters->context).ptr;
    (*(code *)pBVar3[2]._vptr_BoundCastData)(&local_38);
    pEVar4 = unique_ptr<duckdb::EnumCastLocalState,_std::default_delete<duckdb::EnumCastLocalState>,_true>
             ::operator->((unique_ptr<duckdb::EnumCastLocalState,_std::default_delete<duckdb::EnumCastLocalState>,_true>
                           *)&local_30);
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (FunctionLocalState *)0x0;
    _Var1._M_head_impl =
         (pEVar4->from_varchar_local).
         super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
         .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl;
    (pEVar4->from_varchar_local).
    super_unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionLocalState_*,_std::default_delete<duckdb::FunctionLocalState>_>
    .super__Head_base<0UL,_duckdb::FunctionLocalState_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (FunctionLocalState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_FunctionLocalState[1])();
      if (local_38._M_head_impl != (FunctionLocalState *)0x0) {
        (*(local_38._M_head_impl)->_vptr_FunctionLocalState[1])();
      }
    }
  }
  *(EnumCastLocalState **)this = local_30._M_head_impl;
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         this;
}

Assistant:

static unique_ptr<FunctionLocalState> InitEnumCastLocalState(CastLocalStateParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<EnumBoundCastData>();
	auto result = make_uniq<EnumCastLocalState>();

	if (cast_data.from_varchar_cast.init_local_state) {
		CastLocalStateParameters from_varchar_params(parameters, cast_data.from_varchar_cast.cast_data);
		result->from_varchar_local = cast_data.from_varchar_cast.init_local_state(from_varchar_params);
	}
	if (cast_data.to_varchar_cast.init_local_state) {
		CastLocalStateParameters from_varchar_params(parameters, cast_data.to_varchar_cast.cast_data);
		result->from_varchar_local = cast_data.to_varchar_cast.init_local_state(from_varchar_params);
	}
	return std::move(result);
}